

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

int use_container(obj *obj,int held)

{
  obj *poVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *planB;
  size_t sVar8;
  uint icount;
  byte bVar9;
  obj *poVar10;
  bool bVar11;
  int selection [1];
  char qbuf [256];
  char menuprompt [256];
  char emptymsg [256];
  nh_menuitem items [3];
  uint local_774;
  char *local_770;
  int local_764;
  long local_760;
  char local_758 [256];
  char local_658 [256];
  char local_558 [8];
  undefined1 auStack_550 [248];
  char local_458 [256];
  nh_menuitem local_358;
  undefined2 auStack_234 [121];
  nh_bool local_142 [274];
  
  local_458[0] = '\0';
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pcVar6 = "You have no hands!";
LAB_00214ac3:
    local_774 = 0;
    goto LAB_00214ac5;
  }
  iVar3 = freehand();
  if (iVar3 == 0) {
    pcVar6 = body_part(6);
    pline("You have no free %s.",pcVar6);
    return 0;
  }
  if (obj == &zeroobj) {
    current_container = &zeroobj;
    local_774 = 0;
    local_770 = "";
    if (magic_chest_objs == (obj *)0x0) {
LAB_00214d36:
      pcVar6 = "The magic chest";
      goto LAB_00214d4b;
    }
    local_770 = "";
    local_774 = 0;
    poVar10 = magic_chest_objs;
LAB_00214bf4:
    iVar3 = 0;
    local_760 = 0;
    do {
      poVar1 = poVar10->nobj;
      if ((((obj == &zeroobj) || ((obj->otyp & 0xfffeU) != 0xe0)) || ((obj->field_0x4a & 1) == 0))
         || (uVar4 = mt_random(), 0x13b13b13 < uVar4 * -0x3b13b13b)) {
        iVar3 = iVar3 + 1;
      }
      else {
        obj_extract_self(poVar10);
        lVar5 = mbag_item_gone(held,poVar10);
        local_760 = local_760 + lVar5;
        local_774 = 1;
      }
      lVar5 = local_760;
      poVar10 = poVar1;
    } while (poVar1 != (obj *)0x0);
    if (local_760 != 0) {
      pcVar6 = currency(local_760);
      pline("You owe %ld %s for lost merchandise.",lVar5,pcVar6);
    }
    if (obj == &zeroobj) {
      if (iVar3 == 0) {
        pcVar6 = "The magic chest";
        goto LAB_00214d4b;
      }
      bVar11 = true;
      goto LAB_00214e1a;
    }
    uVar4 = weight(obj);
    obj->owt = uVar4;
    if (iVar3 == 0) goto LAB_00214d29;
    bVar11 = true;
LAB_00214daa:
    builtin_strncpy(local_758,"Do you want to take something out of ",0x26);
    pcVar6 = eos(local_758);
    pcVar7 = yname(obj);
    planB = ysimple_name(obj);
    pcVar7 = safe_qbuf(local_758,1,pcVar7,planB,"it");
    sprintf(pcVar6,"%s?",pcVar7);
LAB_00214e32:
    poVar10 = invent;
    if (flags.menu_style != '\x03') {
      cVar2 = yn_function(local_758,"ynq",'n');
      bVar11 = cVar2 == 'y';
      bVar9 = 0;
LAB_002150e1:
      if (bVar11 != false) {
        add_valid_menu_class::vmc_count = 0;
        valid_menu_classes[0] = '\0';
        iVar3 = menu_loot(0,current_container,'\0');
        local_774 = local_774 | iVar3 != 0;
      }
      goto LAB_0021510f;
    }
    if (invent != (obj *)0x0 || bVar11) {
      local_558[0] = '\0';
      if (!bVar11) {
        sprintf(local_558,"%s ",local_458);
      }
      sVar8 = strlen(local_558);
      poVar1 = current_container;
      builtin_strncpy(local_558 + sVar8,"Do what?",8);
      auStack_550[sVar8] = 0;
      uVar4 = 0;
      if (bVar11) {
        if (current_container == &zeroobj) {
          builtin_strncpy(local_658,"Take something out of the magic chest",0x26);
        }
        else {
          pcVar6 = xname(current_container);
          pcVar6 = the(pcVar6);
          sprintf(local_658,"Take something out of %s",pcVar6);
        }
        local_358.id = 1;
        local_358.role = MI_NORMAL;
        local_358.accel = 'o';
        local_358.group_accel = '\0';
        local_358.selected = '\0';
        strcpy(local_358.caption,local_658);
        uVar4 = 1;
      }
      icount = uVar4;
      if (poVar10 != (obj *)0x0) {
        if (poVar1 == &zeroobj) {
          builtin_strncpy(local_658,"Put something into the magic chest",0x23);
        }
        else {
          pcVar6 = xname(poVar1);
          pcVar6 = the(pcVar6);
          sprintf(local_658,"Put something into %s",pcVar6);
        }
        icount = uVar4 + 1;
        (&local_358)[uVar4].id = 2;
        (&local_358)[uVar4].role = MI_NORMAL;
        (&local_358)[uVar4].accel = 'i';
        (&local_358)[uVar4].group_accel = '\0';
        (&local_358)[uVar4].selected = '\0';
        strcpy((&local_358)[uVar4].caption,local_658);
        if (bVar11) {
          (&local_358)[icount].id = 3;
          (&local_358)[icount].role = MI_NORMAL;
          (&local_358)[icount].accel = 'b';
          (&local_358)[icount].group_accel = '\0';
          (&local_358)[icount].selected = '\0';
          builtin_strncpy((&local_358)[icount].caption,"Both of ",8);
          builtin_strncpy((&local_358)[icount].caption + 8,"the abov",8);
          (&local_358)[icount].caption[0x10] = 'e';
          (&local_358)[icount].caption[0x11] = '\0';
          icount = uVar4 | 2;
        }
      }
      iVar3 = display_menu(&local_358,icount,local_558,1,&local_764);
      if (0 < iVar3) {
        iVar3 = local_764;
      }
      if (iVar3 < 1) {
        return 0;
      }
      bVar11 = (bool)((byte)iVar3 & 1);
      bVar9 = (byte)iVar3 >> 1 & 1;
      goto LAB_002150e1;
    }
    pline("%s",local_458);
  }
  else {
    if ((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) {
      pcVar6 = Tobjnam(obj,"seem");
      pline("%s to be locked.",pcVar6);
      if (held == 0) {
        return 0;
      }
      pcVar6 = "You must put it down to unlock.";
      goto LAB_00214ac3;
    }
    if ((short)*(uint *)&obj->field_0x4a < 0) {
      if (held != 0) {
        pcVar6 = xname(obj);
        pcVar6 = the(pcVar6);
        pline("You open %s...",pcVar6);
      }
      chest_trap(obj,6,'\0');
      if (multi < 0) {
        return 1;
      }
      nomul(-1,"opening a trapped container");
      nomovemsg = "";
      return 1;
    }
    bVar11 = obj->spe != '\x01';
    current_container = obj;
    if (bVar11) {
      local_770 = "";
    }
    else {
      observe_quantum_cat(obj);
      local_770 = "now ";
    }
    local_774 = (uint)!bVar11;
    poVar10 = obj->cobj;
    if (poVar10 != (obj *)0x0) goto LAB_00214bf4;
    if (obj == &zeroobj) goto LAB_00214d36;
    uVar4 = weight(obj);
    obj->owt = uVar4;
LAB_00214d29:
    pcVar6 = Yname2(obj);
LAB_00214d4b:
    sprintf(local_458,"%s is %sempty.",pcVar6,local_770);
    if (flags.menu_style == '\x03') {
      bVar11 = false;
      if (obj != &zeroobj) goto LAB_00214daa;
LAB_00214e1a:
      builtin_strncpy(local_758,"Do you want to take something out of ",0x26);
      pcVar6 = eos(local_758);
      builtin_strncpy(pcVar6,"the magic chest?",0x11);
      goto LAB_00214e32;
    }
    bVar9 = 0;
    pline("%s",local_458);
LAB_0021510f:
    if (invent != (obj *)0x0) {
      if (flags.menu_style != '\x03') {
        builtin_strncpy(local_758 + 0x10,"ut something in?",0x11);
        builtin_strncpy(local_758,"Do you wish to p",0x10);
        cVar2 = yn_function(local_758,"ynq",'n');
        if (cVar2 == 'y') goto LAB_002151bb;
        if (cVar2 != 'n') {
          if (cVar2 != 'm') {
            return local_774;
          }
          add_valid_menu_class::vmc_count = 0;
          valid_menu_classes[0] = '\0';
          iVar3 = menu_loot(-2,current_container,'\x01');
          local_774 = local_774 | iVar3 != 0;
        }
      }
      if (bVar9 == 0) {
        return local_774;
      }
LAB_002151bb:
      add_valid_menu_class::vmc_count = 0;
      valid_menu_classes[0] = '\0';
      iVar3 = menu_loot(0,current_container,'\x01');
      return local_774 | iVar3 != 0;
    }
  }
  pcVar6 = "You don\'t have anything to put in.";
LAB_00214ac5:
  pline(pcVar6);
  return local_774;
}

Assistant:

int use_container(struct obj *obj, int held)
{
	struct obj *curr, *otmp;
	boolean quantum_cat = FALSE,
		loot_out = FALSE, loot_in = FALSE;
	char qbuf[BUFSZ], emptymsg[BUFSZ];
	long loss = 0L;
	int cnt = 0, used = 0,
	    menu_on_request;

	emptymsg[0] = '\0';
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	if (!cobj_is_magic_chest(obj)) {
	    if (obj->olocked) {
		pline("%s to be locked.", Tobjnam(obj, "seem"));
		if (held) pline("You must put it down to unlock.");
		return 0;
	    } else if (obj->otrapped) {
		if (held) pline("You open %s...", the(xname(obj)));
		chest_trap(obj, HAND, FALSE);
		/* even if the trap fails, you've used up this turn */
		if (multi >= 0) {	/* in case we didn't become paralyzed */
		    nomul(-1, "opening a trapped container");
		    nomovemsg = "";
		}
		return 1;
	    }
	}

	current_container = obj;	/* for use by in/out_container */

	if (!cobj_is_magic_chest(obj) && obj->spe == 1) {
	    observe_quantum_cat(obj);
	    used = 1;
	    quantum_cat = TRUE;	/* for adjusting "it's empty" message */
	}

	/* Count the number of contained objects. Sometimes toss objects if */
	/* a cursed magic bag.						    */
	if (cobj_is_magic_chest(obj))
	    curr = magic_chest_objs;
	else
	    curr = obj->cobj;
	for (; curr; curr = otmp) {
	    otmp = curr->nobj;
	    if (!cobj_is_magic_chest(obj) && Is_mbag(obj) && obj->cursed && !rn2(13)) {
		obj_extract_self(curr);
		loss += mbag_item_gone(held, curr);
		used = 1;
	    } else {
		cnt++;
	    }
	}

	if (loss)	/* magic bag lost some shop goods */
	    pline("You owe %ld %s for lost merchandise.", loss, currency(loss));
	if (!cobj_is_magic_chest(obj))
	    obj->owt = weight(obj);	/* in case any items were lost */

	if (!cnt) {
	    sprintf(emptymsg, "%s is %sempty.",
		    cobj_is_magic_chest(obj) ? "The magic chest" : Yname2(obj),
		    quantum_cat ? "now " : "");
	}

	if (cnt || flags.menu_style == MENU_FULL) {
	    strcpy(qbuf, "Do you want to take something out of ");
	    if (cobj_is_magic_chest(obj)) {
		sprintf(eos(qbuf), "the magic chest?");
	    } else {
		sprintf(eos(qbuf), "%s?",
			safe_qbuf(qbuf, 1, yname(obj), ysimple_name(obj), "it"));
	    }

	    if (flags.menu_style == MENU_FULL) {
		int t;
		char menuprompt[BUFSZ];
		boolean outokay = (cnt != 0);
		boolean inokay = (invent != 0);

		if (!outokay && !inokay) {
		    pline("%s", emptymsg);
		    pline("You don't have anything to put in.");
		    return used;
		}
		menuprompt[0] = '\0';
		if (!cnt) sprintf(menuprompt, "%s ", emptymsg);
		strcat(menuprompt, "Do what?");
		t = in_or_out_menu(menuprompt, current_container, outokay, inokay);
		if (t <= 0) return 0;
		loot_out = (t & 0x01) != 0;
		loot_in  = (t & 0x02) != 0;
	    } else {	/* MENU_PARTIAL */
		loot_out = (yn_function(qbuf, ynqchars, 'n') == 'y');
	    }
	    
	    if (loot_out) {
		add_valid_menu_class(0);	/* reset */
		used |= menu_loot(0, current_container, FALSE) > 0;
	    }
	    
	} else {
	    pline("%s", emptymsg);		/* <whatever> is empty. */
	}

	if (!invent) {
	    /* nothing to put in, but some feedback is necessary */
	    pline("You don't have anything to put in.");
	    return used;
	}
	if (flags.menu_style != MENU_FULL) {
	    sprintf(qbuf, "Do you wish to put something in?");

	    switch (yn_function(qbuf, ynqchars, 'n')) {
		case 'y':
		    loot_in = TRUE;
		    break;
		case 'n':
		    break;
		case 'm':
		    add_valid_menu_class(0);	  /* reset */
		    menu_on_request = -2; /* triggers ALL_CLASSES */
		    used |= menu_loot(menu_on_request, current_container, TRUE) > 0;
		    break;
		case 'q':
		default:
		    return used;
	    }
	}
	/*
	 * Gone: being nice about only selecting food if we know we are
	 * putting things in an ice chest.
	 */
	if (loot_in) {
	    add_valid_menu_class(0);	  /* reset */
	    used |= menu_loot(0, current_container, TRUE) > 0;
	}

	return used;
}